

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_pcm_deinterleave_s16(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  void *src_local;
  void **dst_local;
  uint local_44;
  ulong uStack_40;
  ma_uint32 iChannel;
  ma_uint64 iFrame;
  ma_int16 *src_s16;
  ma_int16 **dst_s16;
  
  for (uStack_40 = 0; uStack_40 < frameCount; uStack_40 = uStack_40 + 1) {
    for (local_44 = 0; local_44 < channels; local_44 = local_44 + 1) {
      *(undefined2 *)((long)dst[local_44] + uStack_40 * 2) =
           *(undefined2 *)((long)src + (uStack_40 * channels + (ulong)local_44) * 2);
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_deinterleave_s16(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_deinterleave_s16__reference(dst, src, frameCount, channels);
#else
    ma_pcm_deinterleave_s16__optimized(dst, src, frameCount, channels);
#endif
}